

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_parsecfg.c
# Opt level: O3

int parseconfig(char *filename,GlobalConfig *global)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  ParameterError res;
  char *pcVar4;
  size_t sVar5;
  FILE *__stream;
  size_t sVar6;
  byte *pbVar7;
  ulong uVar8;
  OperationConfig *pOVar9;
  byte *nextarg;
  byte *pbVar10;
  byte bVar11;
  byte *__s;
  byte *flag;
  OperationConfig *config;
  _Bool usedarg;
  char filebuffer [512];
  _Bool local_1261;
  byte *local_1260;
  OperationConfig *local_1258;
  uint local_124c;
  char *local_1248;
  GlobalConfig *local_1240;
  char local_1238 [512];
  char local_1038 [4104];
  
  local_1261 = false;
  config = global->first;
  if ((filename == (char *)0x0) || (cVar1 = *filename, cVar1 == '\0')) {
    pcVar4 = homedir();
    if (pcVar4 == (char *)0x0) {
      filename = ".curlrc";
    }
    else {
      sVar5 = strlen(pcVar4);
      if (sVar5 < 0x1f9) {
        filename = local_1238;
        curl_msnprintf(filename,0x200,"%s%s%s",pcVar4,"/",".curlrc");
      }
      else {
        filename = ".curlrc";
      }
      free(pcVar4);
    }
    cVar1 = *filename;
  }
  if ((cVar1 != '-') || (__stream = _stdin, filename[1] != '\0')) {
    __stream = fopen64(filename,"r");
  }
  if (__stream == (FILE *)0x0) {
    return 1;
  }
  local_124c = 0;
  local_1248 = filename;
  local_1240 = global;
LAB_00118ec6:
  __s = (byte *)0x0;
  do {
    pcVar4 = fgets(local_1038,0x1000,__stream);
    if (pcVar4 == (char *)0x0) {
      if (__s != (byte *)0x0) goto LAB_00118f5b;
LAB_00119301:
      iVar3 = 0;
      goto LAB_00119303;
    }
    if (__s == (byte *)0x0) {
      pbVar7 = (byte *)strdup(local_1038);
      if (pbVar7 == (byte *)0x0) goto LAB_00119301;
    }
    else {
      sVar5 = strlen((char *)__s);
      sVar6 = strlen(local_1038);
      pbVar7 = (byte *)realloc(__s,sVar5 + sVar6 + 1);
      if (pbVar7 == (byte *)0x0) {
        free(__s);
        goto LAB_00119301;
      }
      strcpy((char *)(pbVar7 + sVar5),local_1038);
    }
    pcVar4 = strchr((char *)pbVar7,10);
    __s = pbVar7;
  } while (pcVar4 == (char *)0x0);
  *pcVar4 = '\0';
LAB_00118f5b:
  local_124c = local_124c + 1;
  bVar11 = *__s;
  flag = __s;
  pbVar7 = __s;
  while (bVar11 != 0) {
    pbVar7 = pbVar7 + 1;
    iVar3 = Curl_isspace((uint)bVar11);
    if (iVar3 == 0) {
      bVar11 = *flag;
      uVar8 = (ulong)bVar11;
      local_1258 = config;
      if ((0x2f < uVar8) || ((0x840800002401U >> (uVar8 & 0x3f) & 1) == 0)) goto LAB_00118fbc;
      break;
    }
    pbVar10 = flag + 1;
    flag = flag + 1;
    bVar11 = *pbVar10;
  }
  goto LAB_00118fac;
  while( true ) {
    if ((bVar11 != 0x2d) && ((pbVar7[-1] == 0x3a || (pbVar7[-1] == 0x3d)))) goto LAB_00118fee;
    bVar2 = *pbVar7;
    uVar8 = (ulong)bVar2;
    pbVar7 = pbVar7 + 1;
    if (bVar2 == 0) break;
LAB_00118fbc:
    iVar3 = Curl_isspace((int)uVar8);
    if (iVar3 != 0) {
      if (pbVar7[-1] != 0) {
LAB_00118fee:
        pbVar7[-1] = 0;
        bVar2 = *pbVar7;
        config = local_1258;
        if (bVar2 == 0) goto LAB_00119038;
        pbVar7 = pbVar7 + 1;
        goto LAB_00118ffc;
      }
      break;
    }
  }
  goto LAB_00119030;
  while( true ) {
    bVar2 = *pbVar7;
    pbVar7 = pbVar7 + 1;
    if (bVar2 == 0) break;
LAB_00118ffc:
    iVar3 = Curl_isspace((uint)bVar2);
    if ((iVar3 == 0) &&
       ((bVar2 = pbVar7[-1], bVar11 == 0x2d || ((bVar2 != 0x3d && (bVar2 != 0x3a)))))) {
      local_1260 = pbVar7;
      if (bVar2 == 0x22) {
        sVar5 = strlen((char *)pbVar7);
        nextarg = (byte *)malloc(sVar5 + 1);
        pbVar10 = nextarg;
        if (nextarg != (byte *)0x0) {
          do {
            bVar11 = *local_1260;
            local_1260 = local_1260 + 1;
            do {
              if (bVar11 != 0x5c) {
                if ((bVar11 != 0) && (bVar11 != 0x22)) goto switchD_0011919a_caseD_6f;
                *pbVar10 = 0;
                config = local_1258;
                local_1260 = (byte *)CONCAT71((int7)((ulong)pbVar7 >> 8),bVar2 == 0x22);
                goto LAB_0011904f;
              }
              bVar11 = *local_1260;
              local_1260 = local_1260 + 1;
            } while (bVar11 == 0);
            switch(bVar11) {
            case 0x6e:
              bVar11 = 10;
              break;
            case 0x72:
              bVar11 = 0xd;
              break;
            case 0x74:
              bVar11 = 9;
              break;
            case 0x76:
              bVar11 = 0xb;
            }
switchD_0011919a_caseD_6f:
            *pbVar10 = bVar11;
            pbVar10 = pbVar10 + 1;
          } while( true );
        }
        free(__s);
        iVar3 = 1;
LAB_00119303:
        if (__stream == _stdin) {
          return iVar3;
        }
        fclose(__stream);
        return iVar3;
      }
      pbVar7 = pbVar7 + -1;
      pbVar10 = pbVar7;
      goto LAB_001191cb;
    }
  }
LAB_00119030:
  pbVar7 = pbVar7 + -1;
  config = local_1258;
LAB_00119038:
  local_1260 = (byte *)0x0;
  nextarg = (byte *)0x0;
  if (*pbVar7 != 0) {
    nextarg = pbVar7;
  }
LAB_0011904f:
  res = getparameter((char *)flag,(char *)nextarg,&local_1261,local_1240,config);
  if ((nextarg == (byte *)0x0) || (res != PARAM_OK)) {
    if (res == PARAM_OK) goto LAB_00119269;
    if (res == PARAM_NEXT_OPERATION) {
      if ((config->url_list == (getout *)0x0) || (config->url_list->url == (char *)0x0))
      goto LAB_00119269;
      pOVar9 = (OperationConfig *)malloc(0x4a0);
      config->next = pOVar9;
      if (pOVar9 != (OperationConfig *)0x0) {
        config_init(pOVar9);
        pOVar9 = config->next;
        pOVar9->easy = local_1240->easy;
        pOVar9->global = local_1240;
        local_1240->last = pOVar9;
        pOVar9->prev = config;
        config = pOVar9;
        goto LAB_00119269;
      }
      res = PARAM_NO_MEM;
    }
  }
  else if ((*nextarg == 0) || (res = PARAM_GOT_EXTRA_PARAMETER, local_1261 != false))
  goto LAB_00119269;
  if ((*local_1248 == '-') && (local_1248[1] == '\0')) {
    local_1248 = "<stdin>";
  }
  if (res - PARAM_GOT_EXTRA_PARAMETER < 0xfffffffc) {
    pcVar4 = param2text(res);
    warnf(config->global,"%s:%d: warning: \'%s\' %s\n",local_1248,(ulong)local_124c,flag,pcVar4);
  }
LAB_00119269:
  if ((char)local_1260 != '\0') {
    free(nextarg);
  }
LAB_00118fac:
  free(__s);
  goto LAB_00118ec6;
LAB_001191cb:
  config = local_1258;
  if (bVar2 == 0) goto LAB_00119038;
  iVar3 = Curl_isspace((uint)bVar2);
  config = local_1258;
  if (iVar3 != 0) {
    if (*pbVar10 != 0) {
      *pbVar10 = 0;
      pbVar10 = local_1260;
      goto LAB_00119294;
    }
    goto LAB_00119038;
  }
  bVar2 = pbVar10[1];
  pbVar10 = pbVar10 + 1;
  local_1260 = local_1260 + 1;
  goto LAB_001191cb;
  while( true ) {
    local_1260 = pbVar10;
    iVar3 = Curl_isspace((uint)*pbVar10);
    pbVar10 = local_1260 + 1;
    if (iVar3 == 0) break;
LAB_00119294:
    if (*pbVar10 == 0) goto LAB_00119038;
  }
  if ((0x23 < (ulong)*local_1260) || ((0x800002401U >> ((ulong)*local_1260 & 0x3f) & 1) == 0)) {
    warnf(config->global,
          "%s:%d: warning: \'%s\' uses unquoted white space in the line that may cause side-effects!\n"
          ,local_1248,(ulong)local_124c,flag);
  }
  goto LAB_00119038;
}

Assistant:

int parseconfig(const char *filename, struct GlobalConfig *global)
{
  FILE *file;
  char filebuffer[512];
  bool usedarg = FALSE;
  int rc = 0;
  struct OperationConfig *operation = global->first;

  if(!filename || !*filename) {
    /* NULL or no file name attempts to load .curlrc from the homedir! */

#ifndef __AMIGA__
    char *home = homedir();    /* portable homedir finder */
    filename = CURLRC;   /* sensible default */
    if(home) {
      if(strlen(home) < (sizeof(filebuffer) - strlen(CURLRC))) {
        snprintf(filebuffer, sizeof(filebuffer),
                 "%s%s%s", home, DIR_CHAR, CURLRC);

#ifdef WIN32
        /* Check if the file exists - if not, try CURLRC in the same
         * directory as our executable
         */
        file = fopen(filebuffer, FOPEN_READTEXT);
        if(file != NULL) {
          fclose(file);
          filename = filebuffer;
        }
        else {
          /* Get the filename of our executable. GetModuleFileName is
           * already declared via inclusions done in setup header file.
           * We assume that we are using the ASCII version here.
           */
          int n = GetModuleFileNameA(0, filebuffer, sizeof(filebuffer));
          if(n > 0 && n < (int)sizeof(filebuffer)) {
            /* We got a valid filename - get the directory part */
            char *lastdirchar = strrchr(filebuffer, '\\');
            if(lastdirchar) {
              size_t remaining;
              *lastdirchar = 0;
              /* If we have enough space, build the RC filename */
              remaining = sizeof(filebuffer) - strlen(filebuffer);
              if(strlen(CURLRC) < remaining - 1) {
                snprintf(lastdirchar, remaining,
                         "%s%s", DIR_CHAR, CURLRC);
                /* Don't bother checking if it exists - we do
                 * that later
                 */
                filename = filebuffer;
              }
            }
          }
        }
#else /* WIN32 */
        filename = filebuffer;
#endif /* WIN32 */
      }
      Curl_safefree(home); /* we've used it, now free it */
    }

# else /* __AMIGA__ */
    /* On AmigaOS all the config files are into env:
     */
    filename = "ENV:" CURLRC;

#endif
  }

  if(strcmp(filename, "-"))
    file = fopen(filename, FOPEN_READTEXT);
  else
    file = stdin;

  if(file) {
    char *line;
    char *aline;
    char *option;
    char *param;
    int lineno = 0;
    bool dashed_option;

    while(NULL != (aline = my_get_line(file))) {
      int res;
      bool alloced_param = FALSE;
      lineno++;
      line = aline;

      /* line with # in the first non-blank column is a comment! */
      while(*line && ISSPACE(*line))
        line++;

      switch(*line) {
      case '#':
      case '/':
      case '\r':
      case '\n':
      case '*':
      case '\0':
        Curl_safefree(aline);
        continue;
      }

      /* the option keywords starts here */
      option = line;

      /* the option starts with a dash? */
      dashed_option = option[0]=='-'?TRUE:FALSE;

      while(*line && !ISSPACE(*line) && !ISSEP(*line, dashed_option))
        line++;
      /* ... and has ended here */

      if(*line)
        *line++ = '\0'; /* zero terminate, we have a local copy of the data */

#ifdef DEBUG_CONFIG
      fprintf(stderr, "GOT: %s\n", option);
#endif

      /* pass spaces and separator(s) */
      while(*line && (ISSPACE(*line) || ISSEP(*line, dashed_option)))
        line++;

      /* the parameter starts here (unless quoted) */
      if(*line == '\"') {
        /* quoted parameter, do the quote dance */
        line++;
        param = malloc(strlen(line) + 1); /* parameter */
        if(!param) {
          /* out of memory */
          Curl_safefree(aline);
          rc = 1;
          break;
        }
        alloced_param = TRUE;
        (void)unslashquote(line, param);
      }
      else {
        param = line; /* parameter starts here */
        while(*line && !ISSPACE(*line))
          line++;

        if(*line) {
          *line = '\0'; /* zero terminate */

          /* to detect mistakes better, see if there's data following */
          line++;
          /* pass all spaces */
          while(*line && ISSPACE(*line))
            line++;

          switch(*line) {
          case '\0':
          case '\r':
          case '\n':
          case '#': /* comment */
            break;
          default:
            warnf(operation->global, "%s:%d: warning: '%s' uses unquoted "
                  "white space in the line that may cause side-effects!\n",
                  filename, lineno, option);
          }
        }
        if(!*param)
          /* do this so getparameter can check for required parameters.
             Otherwise it always thinks there's a parameter. */
          param = NULL;
      }

#ifdef DEBUG_CONFIG
      fprintf(stderr, "PARAM: \"%s\"\n",(param ? param : "(null)"));
#endif
      res = getparameter(option, param, &usedarg, global, operation);

      if(!res && param && *param && !usedarg)
        /* we passed in a parameter that wasn't used! */
        res = PARAM_GOT_EXTRA_PARAMETER;

      if(res == PARAM_NEXT_OPERATION) {
        if(operation->url_list && operation->url_list->url) {
          /* Allocate the next config */
          operation->next = malloc(sizeof(struct OperationConfig));
          if(operation->next) {
            /* Initialise the newly created config */
            config_init(operation->next);

            /* Copy the easy handle */
            operation->next->easy = global->easy;

            /* Set the global config pointer */
            operation->next->global = global;

            /* Update the last operation pointer */
            global->last = operation->next;

            /* Move onto the new config */
            operation->next->prev = operation;
            operation = operation->next;
          }
          else
            res = PARAM_NO_MEM;
        }
      }

      if(res != PARAM_OK && res != PARAM_NEXT_OPERATION) {
        /* the help request isn't really an error */
        if(!strcmp(filename, "-")) {
          filename = "<stdin>";
        }
        if(res != PARAM_HELP_REQUESTED &&
           res != PARAM_MANUAL_REQUESTED &&
           res != PARAM_VERSION_INFO_REQUESTED &&
           res != PARAM_ENGINES_REQUESTED) {
          const char *reason = param2text(res);
          warnf(operation->global, "%s:%d: warning: '%s' %s\n",
                filename, lineno, option, reason);
        }
      }

      if(alloced_param)
        Curl_safefree(param);

      Curl_safefree(aline);
    }
    if(file != stdin)
      fclose(file);
  }
  else
    rc = 1; /* couldn't open the file */

  return rc;
}